

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O1

void __thiscall Abstract<4U>::print_f1(Abstract<4U> *this,ofstream *out,int num)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  ostream *poVar5;
  undefined1 auVar6 [16];
  
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
  dVar1 = this->pr;
  dVar2 = dVar1 + this->cr;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar2;
  uVar3 = vcmpsd_avx512f(auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d),1);
  bVar4 = (bool)((byte)uVar3 & 1);
  poVar5 = std::ostream::_M_insert<double>
                     (((dVar1 + dVar1) * this->cr) /
                      (double)((ulong)bVar4 * 0x3ff0000000000000 + (ulong)!bVar4 * (long)dVar2));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void print_f1(ofstream& out, int num) {
		cout << name << sep << 2 * this->pr * this->cr / ((this->cr + this->pr < 1e-6) ? 1 : this->cr + pr) << endl;
	}